

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_pkware_encode.c
# Opt level: O3

void trad_pkware_free(trad_pkware_conflict *ctx)

{
  if (ctx != (trad_pkware_conflict *)0x0) {
    free(ctx->password);
    _zip_buffer_free(ctx->buffer);
    zip_error_fini(&ctx->error);
    free(ctx);
    return;
  }
  return;
}

Assistant:

static void
trad_pkware_free(struct trad_pkware *ctx) {
    if (ctx == NULL) {
        return;
    }

    free(ctx->password);
    _zip_buffer_free(ctx->buffer);
    zip_error_fini(&ctx->error);
    free(ctx);
}